

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O0

int log_map_iterator_next(log_map_iterator iterator)

{
  log_map_iterator iterator_local;
  
  if (iterator != (log_map_iterator)0x0) {
    iterator->bucket = iterator->next;
    while (iterator->position < (iterator->map->table).size) {
      while (iterator->bucket != (log_map_bucket_conflict)0x0) {
        if ((iterator->bucket->key != (char *)0x0) && (iterator->bucket->value != (void *)0x0)) {
          iterator->next = iterator->bucket->next;
          return 0;
        }
        iterator->bucket = iterator->bucket->next;
      }
      iterator->position = iterator->position + 1;
      iterator->bucket = (iterator->map->table).data + iterator->position;
    }
  }
  return 1;
}

Assistant:

int log_map_iterator_next(log_map_iterator iterator)
{
	if (iterator == NULL)
	{
		return 1;
	}

	iterator->bucket = iterator->next;

	while (iterator->position < iterator->map->table.size)
	{
		while (iterator->bucket != NULL)
		{
			if (iterator->bucket->key != NULL && iterator->bucket->value != NULL)
			{
				iterator->next = iterator->bucket->next;

				return 0;
			}

			iterator->bucket = iterator->bucket->next;
		}

		++iterator->position;

		iterator->bucket = &iterator->map->table.data[iterator->position];
	}

	return 1;
}